

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O2

void generateDataFile(char *data_file)

{
  void *pvVar1;
  FILE *__stream;
  ostream *poVar2;
  int iVar3;
  uint64_t val_size;
  uint64_t key_size;
  void *local_1f8 [4];
  allocator local_1d8 [8];
  size_t local_1d0;
  stringstream ss;
  long local_1a8;
  string local_1a0 [8];
  long alStack_198 [45];
  
  __stream = fopen(data_file,"wb");
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (iVar3 = 0; iVar3 != 100000; iVar3 = iVar3 + 1) {
    std::__cxx11::string::string((string *)local_1f8,"",local_1d8);
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)local_1f8);
    key_size = 8;
    fwrite(&key_size,8,1,__stream);
    *(long *)((long)alStack_198 + *(long *)(local_1a8 + -0x18)) = (long)(int)key_size;
    poVar2 = std::operator<<(&local_1a8,0x30);
    std::ostream::operator<<(poVar2,iVar3);
    std::__cxx11::stringbuf::str();
    pvVar1 = local_1f8[0];
    std::__cxx11::stringbuf::str();
    fwrite(pvVar1,local_1d0,1,__stream);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::string((string *)local_1f8,"kv_value",local_1d8);
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)local_1f8);
    val_size = 8;
    fwrite(&val_size,8,1,__stream);
    *(long *)((long)alStack_198 + *(long *)(local_1a8 + -0x18)) = (long)(int)val_size;
    poVar2 = std::operator<<(&local_1a8,0x30);
    std::ostream::operator<<(poVar2,iVar3);
    std::__cxx11::stringbuf::str();
    pvVar1 = local_1f8[0];
    std::__cxx11::stringbuf::str();
    fwrite(pvVar1,local_1d0,1,__stream);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1f8);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void generateDataFile(const char* data_file)
{
    FILE* f = fopen(data_file, "wb");

    stringstream ss;

    for (int i = 0; i < 100000; i++)
    {
        ss.str("");
        uint64_t key_size = 8;
        fwrite(&key_size, sizeof(key_size), 1, f);
        ss << setw(key_size) << setfill('0') << i;
        fwrite(ss.str().c_str(), ss.str().size(), 1, f);

        ss.str("kv_value");
        uint64_t val_size = 8;
        fwrite(&val_size, sizeof(val_size), 1, f);
        ss << setw(val_size) << setfill('0') << i;
        fwrite(ss.str().c_str(), ss.str().size(), 1, f);
    }

    fclose(f);
}